

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O2

int readMPS(char *filename,int mxNumRow,int mxNumCol,int *numRow,int *numCol,int *objSense,
           double *objOffset,vector<int,_std::allocator<int>_> *Astart,
           vector<int,_std::allocator<int>_> *Aindex,vector<double,_std::allocator<double>_> *Avalue
           ,vector<double,_std::allocator<double>_> *colCost,
           vector<double,_std::allocator<double>_> *colLower,
           vector<double,_std::allocator<double>_> *colUpper,
           vector<double,_std::allocator<double>_> *rowLower,
           vector<double,_std::allocator<double>_> *rowUpper,
           vector<int,_std::allocator<int>_> *integerColumn)

{
  uint uVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  int iVar6;
  FILE *__stream;
  uint *puVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  vector<double,_std::allocator<double>_> *pvVar10;
  vector<double,_std::allocator<double>_> *pvVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  char flag [2];
  int integerCol;
  uint *local_1b8;
  allocator_type local_1a9;
  double data [3];
  vector<double,_std::allocator<double>_> RHS;
  double local_150;
  value_type_conflict1 local_140;
  vector<char,_std::allocator<char>_> rowType;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> rowIndex;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> colIndex;
  char line [128];
  
  *numRow = 0;
  *numCol = 0;
  *objOffset = 0.0;
  *objSense = 1;
  piVar2 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_1b8 = (uint *)numRow;
  printf("readMPS: Trying to open file %s\n",filename);
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    puts("readMPS: Not opened file OK");
    iVar6 = 1;
  }
  else {
    puts("readMPS: Opened file  OK");
    flag[0] = '\0';
    flag[1] = '\0';
    integerCol = 0;
    load_mpsLine((FILE *)__stream,&integerCol,0x80,line,flag,data);
    load_mpsLine((FILE *)__stream,&integerCol,0x80,line,flag,data);
    puts("readMPS: Read NAME    OK");
    rowType.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    rowIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &rowIndex._M_t._M_impl.super__Rb_tree_header._M_header;
    rowIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    rowIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    rowType.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    rowType.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    rowIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar6 = 2;
    rowIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         rowIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    dVar14 = 0.0;
    while (dVar13 = dVar14, bVar5 = load_mpsLine((FILE *)__stream,&integerCol,0x80,line,flag,data),
          bVar5) {
      if (((flag[0] != 'N') || (dVar13 != 0.0)) || (dVar14 = data[1], NAN(dVar13))) {
        if ((0 < mxNumRow) && (mxNumRow <= (int)*local_1b8)) goto LAB_00151a8c;
        std::vector<char,_std::allocator<char>_>::push_back(&rowType,flag);
        uVar1 = *local_1b8;
        *local_1b8 = uVar1 + 1;
        puVar7 = (uint *)std::
                         map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                         ::operator[](&rowIndex,data + 1);
        *puVar7 = uVar1;
        dVar14 = dVar13;
      }
    }
    puts("readMPS: Read ROWS    OK");
    colIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &colIndex._M_t._M_impl.super__Rb_tree_header._M_header;
    colIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    colIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    colIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_150 = 0.0;
    colIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         colIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (bVar5 = load_mpsLine((FILE *)__stream,&integerCol,0x80,line,flag,data), dVar14 = data[1],
          bVar5) {
      if ((local_150 != data[1]) || (NAN(local_150) || NAN(data[1]))) {
        iVar6 = *numCol;
        if (mxNumCol <= iVar6 && 0 < mxNumCol) {
          iVar6 = 2;
          goto LAB_00151a7f;
        }
        *numCol = iVar6 + 1;
        pmVar8 = std::
                 map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                 ::operator[](&colIndex,data + 1);
        *pmVar8 = iVar6;
        RHS.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(colCost,(double *)&RHS);
        RHS.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(RHS.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     (int)((ulong)((long)(Aindex->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(Aindex->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2));
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(Astart,(int *)&RHS);
        std::vector<int,_std::allocator<int>_>::push_back(integerColumn,&integerCol);
        local_150 = dVar14;
      }
      if ((data[2] != dVar13) || (NAN(data[2]) || NAN(dVar13))) {
        if ((data[0] != 0.0) || (NAN(data[0]))) {
          pmVar8 = std::
                   map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                   ::operator[](&rowIndex,data + 2);
          std::vector<int,_std::allocator<int>_>::push_back(Aindex,pmVar8);
          std::vector<double,_std::allocator<double>_>::push_back(Avalue,data);
        }
      }
      else {
        (colCost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish[-1] = data[0];
      }
    }
    RHS.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT44(RHS.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             (int)((ulong)((long)(Aindex->
                                                 super__Vector_base<int,_std::allocator<int>_>).
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                          (long)(Aindex->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data._M_start) >> 2));
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(Astart,(int *)&RHS);
    puts("readMPS: Read COLUMNS OK");
    local_140 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&RHS,(long)(int)*local_1b8,&local_140,&local_1a9);
    while (bVar5 = load_mpsLine((FILE *)__stream,&integerCol,0x80,line,flag,data), bVar5) {
      if ((data[2] != dVar13) || (NAN(data[2]) || NAN(dVar13))) {
        pmVar8 = std::
                 map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                 ::operator[](&rowIndex,data + 2);
        RHS.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[*pmVar8] = data[0];
      }
      else {
        printf("RHS for N-row in MPS file implies objective offset of %g: ignoring this!\n",data[0])
        ;
        *objOffset = 0.0;
      }
    }
    puts("readMPS: Read RHS     OK");
    std::vector<double,_std::allocator<double>_>::resize(rowLower,(long)(int)*local_1b8);
    std::vector<double,_std::allocator<double>_>::resize(rowUpper,(long)(int)*local_1b8);
    if (flag[0] == 'R') {
      while (bVar5 = load_mpsLine((FILE *)__stream,&integerCol,0x80,line,flag,data), bVar5) {
        pmVar8 = std::
                 map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                 ::operator[](&rowIndex,data + 2);
        iVar6 = *pmVar8;
        if ((rowType.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start[iVar6] == 'L') ||
           ((rowType.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start[iVar6] == 'E' && (data[0] < 0.0)))) {
          dVar14 = RHS.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar6] - ABS(data[0]);
          pvVar10 = rowLower;
          pvVar11 = rowUpper;
        }
        else {
          dVar14 = ABS(data[0]) +
                   RHS.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar6];
          pvVar10 = rowUpper;
          pvVar11 = rowLower;
        }
        (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[iVar6] = dVar14;
        (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[iVar6] =
             RHS.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start[iVar6];
        rowType.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar6] = 'X';
      }
    }
    pdVar3 = (rowLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (rowUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    uVar9 = (ulong)*local_1b8;
    if ((int)*local_1b8 < 1) {
      uVar9 = uVar12;
    }
    for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      switch(rowType.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start[uVar12]) {
      case 'E':
        dVar14 = RHS.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12];
        pdVar3[uVar12] = dVar14;
        break;
      default:
        goto switchD_001517f5_caseD_46;
      case 'G':
        pdVar3[uVar12] =
             RHS.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start[uVar12];
        goto LAB_00151822;
      case 'L':
        pdVar3[uVar12] = -1e+200;
        dVar14 = RHS.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12];
        break;
      case 'N':
        pdVar3[uVar12] = -1e+200;
LAB_00151822:
        dVar14 = 1e+200;
      }
      pdVar4[uVar12] = dVar14;
switchD_001517f5_caseD_46:
    }
    puts("readMPS: Read RANGES  OK");
    local_140 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign(colLower,(long)*numCol,&local_140);
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (colUpper,(long)*numCol,(value_type_conflict1 *)&HSOL_CONST_INF);
    if (flag[0] == 'B') {
      while (bVar5 = load_mpsLine((FILE *)__stream,&integerCol,0x80,line,flag,data), bVar5) {
        pmVar8 = std::
                 map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                 ::operator[](&colIndex,data + 2);
        iVar6 = *pmVar8;
        if ((byte)flag[0] - 0x49 < 10) {
          iVar6 = (*(code *)(&DAT_00158d28 +
                            *(int *)(&DAT_00158d28 + (ulong)((byte)flag[0] - 0x49) * 4)))();
          return iVar6;
        }
        if (flag[0] == 'X') {
          (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar6] = data[0];
          (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar6] = data[0];
        }
      }
    }
    piVar2 = (integerColumn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    uVar9 = (ulong)(uint)*numCol;
    if (*numCol < 1) {
      uVar9 = uVar12;
    }
    for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      if (((piVar2[uVar12] != 0) && (dVar14 = pdVar3[uVar12], dVar14 == 1e+200)) && (!NAN(dVar14)))
      {
        pdVar3[uVar12] = 1.0;
      }
    }
    puts("readMPS: Read BOUNDS  OK");
    puts("readMPS: Read ENDATA  OK");
    iVar6 = 0;
    printf("readMPS: Model has %d rows and %d columns with %d integer\n",(ulong)*local_1b8,
           (ulong)(uint)*numCol,(ulong)(uint)integerCol);
    fclose(__stream);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&RHS.super__Vector_base<double,_std::allocator<double>_>);
LAB_00151a7f:
    std::
    _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
    ::~_Rb_tree(&colIndex._M_t);
LAB_00151a8c:
    std::
    _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
    ::~_Rb_tree(&rowIndex._M_t);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&rowType.super__Vector_base<char,_std::allocator<char>_>);
  }
  return iVar6;
}

Assistant:

int readMPS(const char *filename, int mxNumRow, int mxNumCol,
	    int& numRow, int& numCol, int& objSense, double& objOffset,
	    vector<int>& Astart,  vector<int>& Aindex, vector<double>& Avalue,
	    vector<double>& colCost, vector<double>& colLower, vector<double>& colUpper,
	    vector<double>& rowLower, vector<double>& rowUpper,
	    vector<int>& integerColumn) {

    // MPS file buffer
    numRow = 0;
    numCol = 0;
    objOffset = 0;
    objSense = OBJSENSE_MINIMIZE;

    //Astart.clear() added since setting Astart.push_back(0) in
    //setup_clearModel() messes up the MPS read
    Astart.clear();
#ifdef JAJH_dev
    printf("readMPS: Trying to open file %s\n", filename);
#endif
    FILE *file = fopen(filename, "r");
    if (file == 0) {
#ifdef JAJH_dev
      printf("readMPS: Not opened file OK\n");
#endif
      return 1;
    }
#ifdef JAJH_dev
    printf("readMPS: Opened file  OK\n");
#endif
    // Input buffer
    const int lmax = 128;
    char line[lmax];
    char flag[2] = { 0, 0 };
    double data[3];

    int integerCol = 0;

    // Load NAME and ROWS
    load_mpsLine(file, integerCol, lmax, line, flag, data);
    load_mpsLine(file, integerCol, lmax, line, flag, data);
#ifdef JAJH_dev
    printf("readMPS: Read NAME    OK\n");
#endif

    vector<char> rowType;
    map<double, int> rowIndex;
    double objName = 0;
    while (load_mpsLine(file, integerCol, lmax, line, flag, data)) {
      if (flag[0] == 'N' && objName == 0) {
	objName = data[1];
      } else {
	if (mxNumRow>0 && numRow >= mxNumRow) return 2;
	rowType.push_back(flag[0]);
	rowIndex[data[1]] = numRow++;
      }
    }
#ifdef JAJH_dev
    printf("readMPS: Read ROWS    OK\n");
#endif

    // Load COLUMNS
    map<double, int> colIndex;
    double lastName = 0;
    while (load_mpsLine(file, integerCol, lmax, line, flag, data)) {
      if (lastName != data[1]) { // New column
	if (mxNumCol>0 && numCol >= mxNumCol) return 2;
	lastName = data[1];
	colIndex[data[1]] = numCol++;
	colCost.push_back(0);
	Astart.push_back(Aindex.size());
	integerColumn.push_back(integerCol);
      }
      if (data[2] == objName) // Cost
	colCost.back() = data[0];
      else if (data[0] != 0) {
	Aindex.push_back(rowIndex[data[2]]);
	Avalue.push_back(data[0]);
      }
    }
    Astart.push_back(Aindex.size());

#ifdef JAJH_dev
    printf("readMPS: Read COLUMNS OK\n");
#endif

    // Load RHS
    vector<double> RHS(numRow, 0);
    while (load_mpsLine(file, integerCol, lmax, line, flag, data)) {
        if (data[2] != objName) {
            int iRow = rowIndex[data[2]];
            RHS[iRow] = data[0];
        } else {
//        	Strictly, if there is a RHS entry for the N row, it is an objective offset
//        	However, the reported objective values for problems (eg e226) ignore this
#ifdef JAJH_dev
        	printf("RHS for N-row in MPS file implies objective offset of %g: ignoring this!\n", data[0]);
#endif
//            objOffset = data[0]; // Objective offset
            objOffset = 0;
        }
    }
#ifdef JAJH_dev
    printf("readMPS: Read RHS     OK\n");
#endif

    // Load RANGES
    rowLower.resize(numRow);
    rowUpper.resize(numRow);
    if (flag[0] == 'R') {
        while (load_mpsLine(file, integerCol, lmax, line, flag, data)) {
            int iRow = rowIndex[data[2]];
            if (rowType[iRow] == 'L' || (rowType[iRow] == 'E' && data[0] < 0)) {
                rowLower[iRow] = RHS[iRow] - fabs(data[0]);
                rowUpper[iRow] = RHS[iRow];
            } else {
                rowUpper[iRow] = RHS[iRow] + fabs(data[0]);
                rowLower[iRow] = RHS[iRow];
            }
            rowType[iRow] = 'X';
        }
    }

    // Setup bounds for row without 'RANGE'
    for (int iRow = 0; iRow < numRow; iRow++) {
        switch (rowType[iRow]) {
        case 'L':
            rowLower[iRow] = -HSOL_CONST_INF;
            rowUpper[iRow] = RHS[iRow];
            break;
        case 'G':
            rowLower[iRow] = RHS[iRow];
            rowUpper[iRow] = +HSOL_CONST_INF;
            break;
        case 'E':
            rowLower[iRow] = RHS[iRow];
            rowUpper[iRow] = RHS[iRow];
            break;
        case 'N':
            rowLower[iRow] = -HSOL_CONST_INF;
            rowUpper[iRow] = +HSOL_CONST_INF;
            break;
        case 'X':
            break;
        }
    }
#ifdef JAJH_dev
    printf("readMPS: Read RANGES  OK\n");
#endif

    // Load BOUNDS
    colLower.assign(numCol, 0);
    colUpper.assign(numCol, HSOL_CONST_INF);

    if (flag[0] == 'B') {
        while (load_mpsLine(file, integerCol, lmax, line, flag, data)) {
            int iCol = colIndex[data[2]];

            switch (flag[0]) {
            case 'O': /*LO*/
                colLower[iCol] = data[0];
                break;
            case 'I': /*MI*/
                colLower[iCol] = -HSOL_CONST_INF;
                break;
            case 'L': /*PL*/
                colUpper[iCol] = HSOL_CONST_INF;
                break;
            case 'X': /*FX*/
                colLower[iCol] = data[0];
                colUpper[iCol] = data[0];
                break;
            case 'R': /*FR*/
                colLower[iCol] = -HSOL_CONST_INF;
                colUpper[iCol] = HSOL_CONST_INF;
                break;
            case 'P': /*UP*/
                colUpper[iCol] = data[0];
                if (colLower[iCol] == 0 && data[0] < 0)
                    colLower[iCol] = -HSOL_CONST_INF;
                break;
            }
        }
    }

    //bounds of [0,1] for integer variables without bounds
    for (int iCol = 0; iCol < numCol; iCol++) {
      if (integerColumn[iCol]) {
	if (colUpper[iCol] == HSOL_CONST_INF)
	  colUpper[iCol] = 1;
      }
    }

#ifdef JAJH_dev
    printf("readMPS: Read BOUNDS  OK\n");
    printf("readMPS: Read ENDATA  OK\n");
    printf("readMPS: Model has %d rows and %d columns with %d integer\n", numRow, numCol, integerCol);
#endif
    // Load ENDATA and close file
    fclose(file);
    return 0;
}